

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QMessageDialogOptions::CustomButton>::reallocateAndGrow
          (QArrayDataPointer<QMessageDialogOptions::CustomButton> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<QMessageDialogOptions::CustomButton> *old)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  CustomButton *pCVar5;
  void *pvVar6;
  CustomButton *pCVar7;
  int iVar8;
  long lVar9;
  CustomButton *pCVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<QMessageDialogOptions::CustomButton> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (CustomButton *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar9 = this->size + (n >> 0x3f & n);
    if (((this->d == (Data *)0x0) ||
        (old != (QArrayDataPointer<QMessageDialogOptions::CustomButton> *)0x0)) ||
       (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      if ((lVar9 != 0) && (0 < lVar9)) {
        pCVar10 = this->ptr;
        pCVar5 = pCVar10 + lVar9;
        do {
          pDVar1 = (pCVar10->label).d.d;
          local_38.ptr[local_38.size].label.d.d = pDVar1;
          local_38.ptr[local_38.size].label.d.ptr = (pCVar10->label).d.ptr;
          local_38.ptr[local_38.size].label.d.size = (pCVar10->label).d.size;
          if (pDVar1 != (Data *)0x0) {
            LOCK();
            (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1)
            ;
            UNLOCK();
          }
          iVar8 = pCVar10->id;
          pvVar6 = pCVar10->button;
          local_38.ptr[local_38.size].role = pCVar10->role;
          local_38.ptr[local_38.size].id = iVar8;
          local_38.ptr[local_38.size].button = pvVar6;
          pCVar10 = pCVar10 + 1;
          local_38.size = local_38.size + 1;
        } while (pCVar10 < pCVar5);
      }
    }
    else if ((lVar9 != 0) && (0 < lVar9)) {
      pCVar10 = this->ptr;
      pCVar5 = pCVar10 + lVar9;
      do {
        pDVar1 = (pCVar10->label).d.d;
        (pCVar10->label).d.d = (Data *)0x0;
        local_38.ptr[local_38.size].label.d.d = pDVar1;
        pcVar2 = (pCVar10->label).d.ptr;
        (pCVar10->label).d.ptr = (char16_t *)0x0;
        local_38.ptr[local_38.size].label.d.ptr = pcVar2;
        qVar3 = (pCVar10->label).d.size;
        (pCVar10->label).d.size = 0;
        local_38.ptr[local_38.size].label.d.size = qVar3;
        iVar8 = pCVar10->id;
        pvVar6 = pCVar10->button;
        pCVar7 = local_38.ptr + local_38.size;
        pCVar7->role = pCVar10->role;
        pCVar7->id = iVar8;
        *(void **)(&pCVar7->role + 2) = pvVar6;
        pCVar10 = pCVar10 + 1;
        local_38.size = local_38.size + 1;
      } while (pCVar10 < pCVar5);
    }
  }
  pDVar4 = this->d;
  pCVar5 = this->ptr;
  this->d = local_38.d;
  this->ptr = local_38.ptr;
  qVar3 = this->size;
  this->size = local_38.size;
  local_38.d = pDVar4;
  local_38.ptr = pCVar5;
  local_38.size = qVar3;
  if (old != (QArrayDataPointer<QMessageDialogOptions::CustomButton> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = pDVar4;
    old->ptr = pCVar5;
    local_38.size = old->size;
    old->size = qVar3;
  }
  ~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }